

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void detectEWMH(void)

{
  unsigned_long uVar1;
  unsigned_long atomCount;
  Atom *supportedAtoms;
  Window *windowFromChild;
  Window *windowFromRoot;
  
  windowFromChild = (Window *)0x0;
  uVar1 = _glfwGetWindowPropertyX11
                    (_glfw.x11.root,_glfw.x11.NET_SUPPORTING_WM_CHECK,0x21,
                     (uchar **)&windowFromChild);
  if (uVar1 != 0) {
    _glfwGrabErrorHandlerX11();
    supportedAtoms = (Atom *)0x0;
    uVar1 = _glfwGetWindowPropertyX11
                      (*windowFromChild,_glfw.x11.NET_SUPPORTING_WM_CHECK,0x21,
                       (uchar **)&supportedAtoms);
    if (uVar1 == 0) {
      XFree(windowFromChild);
    }
    else {
      _glfwReleaseErrorHandlerX11();
      if (*windowFromChild == *supportedAtoms) {
        XFree(windowFromChild);
        XFree(supportedAtoms);
        atomCount = 0;
        uVar1 = _glfwGetWindowPropertyX11
                          (_glfw.x11.root,_glfw.x11.NET_SUPPORTED,4,(uchar **)&atomCount);
        _glfw.x11.NET_WM_STATE = getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_STATE");
        _glfw.x11.NET_WM_STATE_ABOVE =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_STATE_ABOVE");
        _glfw.x11.NET_WM_STATE_FULLSCREEN =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_STATE_FULLSCREEN");
        _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_STATE_MAXIMIZED_VERT");
        _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_STATE_MAXIMIZED_HORZ");
        _glfw.x11.NET_WM_STATE_DEMANDS_ATTENTION =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_STATE_DEMANDS_ATTENTION");
        _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_FULLSCREEN_MONITORS");
        _glfw.x11.NET_WM_WINDOW_TYPE =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_WINDOW_TYPE");
        _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WM_WINDOW_TYPE_NORMAL");
        _glfw.x11.NET_WORKAREA = getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_WORKAREA");
        _glfw.x11.NET_CURRENT_DESKTOP =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_CURRENT_DESKTOP");
        _glfw.x11.NET_ACTIVE_WINDOW =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_ACTIVE_WINDOW");
        _glfw.x11.NET_FRAME_EXTENTS =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_FRAME_EXTENTS");
        _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
             getAtomIfSupported((Atom *)atomCount,uVar1,"_NET_REQUEST_FRAME_EXTENTS");
        if (atomCount != 0) {
          XFree(atomCount);
        }
      }
      else {
        XFree(windowFromChild);
        XFree(supportedAtoms);
      }
    }
  }
  return;
}

Assistant:

static void detectEWMH(void)
{
    // First we read the _NET_SUPPORTING_WM_CHECK property on the root window

    Window* windowFromRoot = NULL;
    if (!_glfwGetWindowPropertyX11(_glfw.x11.root,
                                   _glfw.x11.NET_SUPPORTING_WM_CHECK,
                                   XA_WINDOW,
                                   (unsigned char**) &windowFromRoot))
    {
        return;
    }

    _glfwGrabErrorHandlerX11();

    // If it exists, it should be the XID of a top-level window
    // Then we look for the same property on that window

    Window* windowFromChild = NULL;
    if (!_glfwGetWindowPropertyX11(*windowFromRoot,
                                   _glfw.x11.NET_SUPPORTING_WM_CHECK,
                                   XA_WINDOW,
                                   (unsigned char**) &windowFromChild))
    {
        XFree(windowFromRoot);
        return;
    }

    _glfwReleaseErrorHandlerX11();

    // If the property exists, it should contain the XID of the window

    if (*windowFromRoot != *windowFromChild)
    {
        XFree(windowFromRoot);
        XFree(windowFromChild);
        return;
    }

    XFree(windowFromRoot);
    XFree(windowFromChild);

    // We are now fairly sure that an EWMH-compliant WM is currently running
    // We can now start querying the WM about what features it supports by
    // looking in the _NET_SUPPORTED property on the root window
    // It should contain a list of supported EWMH protocol and state atoms

    Atom* supportedAtoms = NULL;
    const unsigned long atomCount =
        _glfwGetWindowPropertyX11(_glfw.x11.root,
                                  _glfw.x11.NET_SUPPORTED,
                                  XA_ATOM,
                                  (unsigned char**) &supportedAtoms);

    // See which of the atoms we support that are supported by the WM

    _glfw.x11.NET_WM_STATE =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_STATE");
    _glfw.x11.NET_WM_STATE_ABOVE =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_STATE_ABOVE");
    _glfw.x11.NET_WM_STATE_FULLSCREEN =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_STATE_FULLSCREEN");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_VERT");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_HORZ");
    _glfw.x11.NET_WM_STATE_DEMANDS_ATTENTION =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_STATE_DEMANDS_ATTENTION");
    _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_FULLSCREEN_MONITORS");
    _glfw.x11.NET_WM_WINDOW_TYPE =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE");
    _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE_NORMAL");
    _glfw.x11.NET_WORKAREA =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_WORKAREA");
    _glfw.x11.NET_CURRENT_DESKTOP =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_CURRENT_DESKTOP");
    _glfw.x11.NET_ACTIVE_WINDOW =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_ACTIVE_WINDOW");
    _glfw.x11.NET_FRAME_EXTENTS =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_FRAME_EXTENTS");
    _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
        getAtomIfSupported(supportedAtoms, atomCount, "_NET_REQUEST_FRAME_EXTENTS");

    if (supportedAtoms)
        XFree(supportedAtoms);
}